

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void testing::internal::MatcherBase<std::pair<phmap::priv::NonStandardLayout,int>const&>::
     ValuePolicy<testing::internal::EqMatcher<std::pair<phmap::priv::NonStandardLayout,int>>,false>
     ::Init<testing::internal::EqMatcher<std::pair<phmap::priv::NonStandardLayout,int>>>
               (MatcherBase<const_std::pair<phmap::priv::NonStandardLayout,_int>_&> *m,
               EqMatcher<std::pair<phmap::priv::NonStandardLayout,_int>_> *arg)

{
  pointer pcVar1;
  undefined4 *puVar2;
  
  puVar2 = (undefined4 *)operator_new(0x38);
  *puVar2 = 1;
  *(undefined ***)(puVar2 + 2) = &PTR__NonStandardLayout_00337320;
  *(undefined4 **)(puVar2 + 4) = puVar2 + 8;
  pcVar1 = (arg->
           super_ComparisonBase<testing::internal::EqMatcher<std::pair<phmap::priv::NonStandardLayout,_int>_>,_std::pair<phmap::priv::NonStandardLayout,_int>,_std::equal_to<void>_>
           ).rhs_.first.value._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 4),pcVar1,
             pcVar1 + (arg->
                      super_ComparisonBase<testing::internal::EqMatcher<std::pair<phmap::priv::NonStandardLayout,_int>_>,_std::pair<phmap::priv::NonStandardLayout,_int>,_std::equal_to<void>_>
                      ).rhs_.first.value._M_string_length);
  puVar2[0xc] = (arg->
                super_ComparisonBase<testing::internal::EqMatcher<std::pair<phmap::priv::NonStandardLayout,_int>_>,_std::pair<phmap::priv::NonStandardLayout,_int>,_std::equal_to<void>_>
                ).rhs_.second;
  (m->buffer_).ptr = puVar2;
  return;
}

Assistant:

static void Init(MatcherBase& m, Arg&& arg) {
      m.buffer_.shared = new Shared(std::forward<Arg>(arg));
    }